

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::cmExtraEclipseCDT4Generator(cmExtraEclipseCDT4Generator *this)

{
  cmExtraEclipseCDT4Generator *this_local;
  
  memset(this,0,0x48);
  cmExternalMakefileProjectGenerator::cmExternalMakefileProjectGenerator
            (&this->super_cmExternalMakefileProjectGenerator);
  (this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExtraEclipseCDT4Generator_00bf6098;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->SrcLinkedResources);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Natures);
  std::__cxx11::string::string((string *)&this->HomeDirectory);
  std::__cxx11::string::string((string *)&this->HomeOutputDirectory);
  this->SupportsVirtualFolders = true;
  this->GenerateLinkedResources = true;
  this->SupportsGmakeErrorParser = true;
  this->SupportsMachO64Parser = true;
  this->CEnabled = false;
  this->CXXEnabled = false;
  return;
}

Assistant:

cmExtraEclipseCDT4Generator::cmExtraEclipseCDT4Generator()
  : cmExternalMakefileProjectGenerator()
{
  this->SupportsVirtualFolders = true;
  this->GenerateLinkedResources = true;
  this->SupportsGmakeErrorParser = true;
  this->SupportsMachO64Parser = true;
  this->CEnabled = false;
  this->CXXEnabled = false;
}